

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  byte bVar26;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  byte bVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar49;
  StackItemT<embree::NodeRefPtr<4>_> SVar50;
  StackItemT<embree::NodeRefPtr<4>_> SVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar65;
  vint4 bi;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  vint4 ai_1;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 local_11d8 [16];
  Geometry *local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  Scene *local_11a8;
  long local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar34 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar85 = ZEXT1664(auVar43);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar86 = ZEXT1664(auVar44);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar87 = ZEXT1664(auVar45);
  auVar43 = vmulss_avx512f(auVar43,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar44 = vmulss_avx512f(auVar44,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar65 = auVar43._0_4_;
  auVar62._4_4_ = uVar65;
  auVar62._0_4_ = uVar65;
  auVar62._8_4_ = uVar65;
  auVar62._12_4_ = uVar65;
  auVar46._0_4_ = auVar44._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar43 = vmulss_avx512f(auVar45,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar65 = auVar43._0_4_;
  auVar45._4_4_ = uVar65;
  auVar45._0_4_ = uVar65;
  auVar45._8_4_ = uVar65;
  auVar45._12_4_ = uVar65;
  local_11b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = local_11b0 ^ 0x10;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar70 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar88 = ZEXT1664(auVar43);
  auVar44 = vxorps_avx512vl(auVar62,auVar43);
  auVar89 = ZEXT1664(auVar44);
  auVar44 = vxorps_avx512vl(auVar46,auVar43);
  auVar90 = ZEXT1664(auVar44);
  auVar43 = vxorps_avx512vl(auVar45,auVar43);
  auVar91 = ZEXT1664(auVar43);
  auVar43 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar92 = ZEXT1664(auVar43);
  auVar43 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar93 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar94 = ZEXT1664(auVar43);
  auVar43 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar95 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar96 = ZEXT1664(auVar43);
LAB_01cb22b7:
  do {
    do {
      if (pSVar34 == stack) {
        return;
      }
      pSVar27 = pSVar34 + -1;
      pSVar34 = pSVar34 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar27->dist);
    uVar42 = (pSVar34->ptr).ptr;
    while ((uVar42 & 8) == 0) {
      auVar43 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + local_11b0),auVar89._0_16_,
                           auVar85._0_16_);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar36),auVar90._0_16_,
                           auVar86._0_16_);
      auVar43 = vpmaxsd_avx(auVar43,auVar44);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar33),auVar91._0_16_,
                           auVar87._0_16_);
      auVar44 = vpmaxsd_avx512vl(auVar44,auVar92._0_16_);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar43,auVar44);
      auVar43 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar38),auVar89._0_16_,
                           auVar85._0_16_);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar36 ^ 0x10)),auVar90._0_16_,
                           auVar86._0_16_);
      auVar43 = vpminsd_avx(auVar43,auVar44);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar33 ^ 0x10)),auVar91._0_16_,
                           auVar87._0_16_);
      auVar44 = vpminsd_avx(auVar44,auVar70._0_16_);
      auVar43 = vpminsd_avx(auVar43,auVar44);
      uVar41 = vpcmpd_avx512vl((undefined1  [16])tNear.field_0,auVar43,2);
      uVar41 = uVar41 & 0xf;
      if ((char)uVar41 == '\0') goto LAB_01cb22b7;
      uVar39 = uVar42 & 0xfffffffffffffff0;
      lVar37 = 0;
      for (uVar42 = uVar41; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar42 = *(ulong *)(uVar39 + lVar37 * 8);
      uVar30 = (uint)uVar41 - 1 & (uint)uVar41;
      uVar41 = (ulong)uVar30;
      if (uVar30 != 0) {
        uVar32 = tNear.field_0.i[lVar37];
        lVar37 = 0;
        for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        uVar31 = (ulong)uVar30;
        uVar41 = *(ulong *)(uVar39 + lVar37 * 8);
        uVar35 = tNear.field_0.i[lVar37];
        if (uVar30 == 0) {
          if (uVar32 < uVar35) {
            (pSVar34->ptr).ptr = uVar41;
            pSVar34->dist = uVar35;
            pSVar34 = pSVar34 + 1;
          }
          else {
            (pSVar34->ptr).ptr = uVar42;
            pSVar34->dist = uVar32;
            pSVar34 = pSVar34 + 1;
            uVar42 = uVar41;
          }
        }
        else {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar42;
          auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar32));
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar41;
          auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar35));
          lVar37 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          uVar42 = (ulong)uVar30;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(uVar39 + lVar37 * 8);
          auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416((uint)tNear.field_0.i[lVar37]));
          auVar45 = vpshufd_avx(auVar43,0xaa);
          auVar46 = vpshufd_avx(auVar44,0xaa);
          auVar62 = vpshufd_avx(auVar61,0xaa);
          if (uVar30 == 0) {
            uVar42 = vpcmpgtd_avx512vl(auVar46,auVar45);
            uVar42 = uVar42 & 0xf;
            auVar46 = vpblendmd_avx512vl(auVar44,auVar43);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar60._0_4_ = (uint)bVar10 * auVar46._0_4_ | (uint)!bVar10 * auVar45._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar10 * auVar46._4_4_ | (uint)!bVar10 * auVar45._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar10 * auVar46._8_4_ | (uint)!bVar10 * auVar45._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar60._12_4_ = (uint)bVar10 * auVar46._12_4_ | (uint)!bVar10 * auVar45._12_4_;
            auVar44 = vmovdqa32_avx512vl(auVar44);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar47._0_4_ = (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * auVar43._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar43._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar43._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar47._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar43._12_4_;
            auVar43 = vpshufd_avx(auVar60,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar62,auVar43);
            uVar41 = uVar41 & 0xf;
            auVar44 = vpblendmd_avx512vl(auVar61,auVar60);
            bVar10 = (bool)((byte)uVar41 & 1);
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            uVar42 = CONCAT44((uint)bVar11 * auVar44._4_4_ | (uint)!bVar11 * auVar43._4_4_,
                              (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * auVar43._0_4_);
            auVar43 = vmovdqa32_avx512vl(auVar61);
            bVar10 = (bool)((byte)uVar41 & 1);
            auVar48._0_4_ = (uint)bVar10 * auVar43._0_4_ | !bVar10 * auVar60._0_4_;
            bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar10 * auVar43._4_4_ | !bVar10 * auVar60._4_4_;
            bVar10 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar10 * auVar43._8_4_ | !bVar10 * auVar60._8_4_;
            bVar10 = SUB81(uVar41 >> 3,0);
            auVar48._12_4_ = (uint)bVar10 * auVar43._12_4_ | !bVar10 * auVar60._12_4_;
            auVar43 = vpshufd_avx(auVar48,0xaa);
            auVar44 = vpshufd_avx(auVar47,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar43,auVar44);
            uVar41 = uVar41 & 0xf;
            auVar44 = vpblendmd_avx512vl(auVar48,auVar47);
            bVar10 = (bool)((byte)uVar41 & 1);
            SVar49.ptr.ptr._0_4_ = (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * auVar43._0_4_;
            bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
            SVar49.ptr.ptr._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar43._4_4_;
            bVar10 = (bool)((byte)(uVar41 >> 2) & 1);
            SVar49.dist = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar43._8_4_;
            bVar10 = SUB81(uVar41 >> 3,0);
            SVar49._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar43._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar48);
            bVar10 = (bool)((byte)uVar41 & 1);
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar41 >> 2) & 1);
            bVar14 = SUB81(uVar41 >> 3,0);
            *(uint *)&(pSVar34->ptr).ptr = (uint)bVar10 * auVar43._0_4_ | !bVar10 * auVar47._0_4_;
            *(uint *)((long)&(pSVar34->ptr).ptr + 4) =
                 (uint)bVar11 * auVar43._4_4_ | !bVar11 * auVar47._4_4_;
            pSVar34->dist = (uint)bVar12 * auVar43._8_4_ | !bVar12 * auVar47._8_4_;
            *(uint *)&pSVar34->field_0xc = (uint)bVar14 * auVar43._12_4_ | !bVar14 * auVar47._12_4_;
            pSVar34[1] = SVar49;
            pSVar34 = pSVar34 + 2;
          }
          else {
            lVar37 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar37 = lVar37 + 1;
            }
            uVar30 = tNear.field_0.i[lVar37];
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(uVar39 + lVar37 * 8);
            auVar55 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar30));
            uVar42 = vpcmpgtd_avx512vl(auVar46,auVar45);
            uVar42 = uVar42 & 0xf;
            auVar46 = vpblendmd_avx512vl(auVar44,auVar43);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar56._0_4_ = (uint)bVar10 * auVar46._0_4_ | (uint)!bVar10 * auVar45._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar10 * auVar46._4_4_ | (uint)!bVar10 * auVar45._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar10 * auVar46._8_4_ | (uint)!bVar10 * auVar45._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar56._12_4_ = (uint)bVar10 * auVar46._12_4_ | (uint)!bVar10 * auVar45._12_4_;
            auVar44 = vmovdqa32_avx512vl(auVar44);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar54._0_4_ = (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * auVar43._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar43._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar43._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar54._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar43._12_4_;
            auVar58._4_4_ = uVar30;
            auVar58._0_4_ = uVar30;
            auVar58._8_4_ = uVar30;
            auVar58._12_4_ = uVar30;
            uVar42 = vpcmpgtd_avx512vl(auVar58,auVar62);
            uVar42 = uVar42 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar55,auVar61);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar52._0_4_ = (uint)bVar10 * auVar43._0_4_ | !bVar10 * uVar30;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar10 * auVar43._4_4_ | !bVar10 * uVar30;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar10 * auVar43._8_4_ | !bVar10 * uVar30;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar52._12_4_ = (uint)bVar10 * auVar43._12_4_ | !bVar10 * uVar30;
            auVar43 = vmovdqa32_avx512vl(auVar55);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar55._0_4_ = (uint)bVar10 * auVar43._0_4_ | (uint)!bVar10 * auVar61._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar61._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar61._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar55._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar61._12_4_;
            auVar43 = vpshufd_avx(auVar55,0xaa);
            auVar44 = vpshufd_avx(auVar54,0xaa);
            uVar42 = vpcmpgtd_avx512vl(auVar43,auVar44);
            uVar42 = uVar42 & 0xf;
            auVar44 = vpblendmd_avx512vl(auVar55,auVar54);
            bVar10 = (bool)((byte)uVar42 & 1);
            auVar53._0_4_ = (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * auVar43._0_4_;
            bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar43._4_4_;
            bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar43._8_4_;
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar53._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar43._12_4_;
            auVar45 = vmovdqa32_avx512vl(auVar55);
            bVar10 = (bool)((byte)uVar42 & 1);
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar42 >> 2) & 1);
            bVar15 = SUB81(uVar42 >> 3,0);
            auVar43 = vpshufd_avx(auVar52,0xaa);
            auVar44 = vpshufd_avx(auVar56,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar43,auVar44);
            uVar41 = uVar41 & 0xf;
            auVar44 = vpblendmd_avx512vl(auVar52,auVar56);
            bVar11 = (bool)((byte)uVar41 & 1);
            bVar14 = (bool)((byte)(uVar41 >> 1) & 1);
            uVar42 = CONCAT44((uint)bVar14 * auVar44._4_4_ | (uint)!bVar14 * auVar43._4_4_,
                              (uint)bVar11 * auVar44._0_4_ | (uint)!bVar11 * auVar43._0_4_);
            auVar43 = vmovdqa32_avx512vl(auVar52);
            bVar11 = (bool)((byte)uVar41 & 1);
            auVar57._0_4_ = (uint)bVar11 * auVar43._0_4_ | !bVar11 * auVar56._0_4_;
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar11 * auVar43._4_4_ | !bVar11 * auVar56._4_4_;
            bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar11 * auVar43._8_4_ | !bVar11 * auVar56._8_4_;
            bVar11 = SUB81(uVar41 >> 3,0);
            auVar57._12_4_ = (uint)bVar11 * auVar43._12_4_ | !bVar11 * auVar56._12_4_;
            auVar43 = vpshufd_avx(auVar57,0xaa);
            auVar44 = vpshufd_avx(auVar53,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar44,auVar43);
            uVar41 = uVar41 & 0xf;
            auVar44 = vpblendmd_avx512vl(auVar53,auVar57);
            bVar11 = (bool)((byte)uVar41 & 1);
            SVar50.ptr.ptr._0_4_ = (uint)bVar11 * auVar44._0_4_ | (uint)!bVar11 * auVar43._0_4_;
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            SVar50.ptr.ptr._4_4_ = (uint)bVar11 * auVar44._4_4_ | (uint)!bVar11 * auVar43._4_4_;
            bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
            SVar50.dist = (uint)bVar11 * auVar44._8_4_ | (uint)!bVar11 * auVar43._8_4_;
            bVar11 = SUB81(uVar41 >> 3,0);
            SVar50._12_4_ = (uint)bVar11 * auVar44._12_4_ | (uint)!bVar11 * auVar43._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar53);
            bVar11 = (bool)((byte)uVar41 & 1);
            SVar51.ptr.ptr._0_4_ = (uint)bVar11 * auVar43._0_4_ | !bVar11 * auVar57._0_4_;
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            SVar51.ptr.ptr._4_4_ = (uint)bVar11 * auVar43._4_4_ | !bVar11 * auVar57._4_4_;
            bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
            SVar51.dist = (uint)bVar11 * auVar43._8_4_ | !bVar11 * auVar57._8_4_;
            bVar11 = SUB81(uVar41 >> 3,0);
            SVar51._12_4_ = (uint)bVar11 * auVar43._12_4_ | !bVar11 * auVar57._12_4_;
            *(uint *)&(pSVar34->ptr).ptr = (uint)bVar10 * auVar45._0_4_ | !bVar10 * auVar54._0_4_;
            *(uint *)((long)&(pSVar34->ptr).ptr + 4) =
                 (uint)bVar12 * auVar45._4_4_ | !bVar12 * auVar54._4_4_;
            pSVar34->dist = (uint)bVar13 * auVar45._8_4_ | !bVar13 * auVar54._8_4_;
            *(uint *)&pSVar34->field_0xc = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar54._12_4_;
            pSVar34[1] = SVar51;
            pSVar34[2] = SVar50;
            pSVar34 = pSVar34 + 3;
          }
        }
      }
    }
    local_11a0 = (ulong)((uint)uVar42 & 0xf) - 8;
    uVar42 = uVar42 & 0xfffffffffffffff0;
    for (lVar37 = 0; lVar37 != local_11a0; lVar37 = lVar37 + 1) {
      lVar28 = lVar37 * 0x50;
      local_11a8 = context->scene;
      ppfVar4 = (local_11a8->vertices).items;
      pfVar5 = ppfVar4[*(uint *)(uVar42 + 0x30 + lVar28)];
      pfVar6 = ppfVar4[*(uint *)(uVar42 + 0x34 + lVar28)];
      pfVar7 = ppfVar4[*(uint *)(uVar42 + 0x38 + lVar28)];
      pfVar8 = ppfVar4[*(uint *)(uVar42 + 0x3c + lVar28)];
      auVar45 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 8 + lVar28)));
      auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 8 + lVar28)));
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 4 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0xc + lVar28)));
      auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 4 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0xc + lVar28)));
      auVar56 = vunpcklps_avx(auVar43,auVar44);
      auVar54 = vunpcklps_avx(auVar45,auVar46);
      auVar55 = vunpckhps_avx(auVar45,auVar46);
      auVar45 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x10 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x18 + lVar28)));
      auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x10 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x18 + lVar28)));
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x14 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x1c + lVar28)));
      auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x14 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x1c + lVar28)));
      auVar61 = vunpcklps_avx(auVar43,auVar44);
      auVar52 = vunpcklps_avx(auVar45,auVar46);
      auVar44 = vunpckhps_avx(auVar45,auVar46);
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x20 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x28 + lVar28)));
      auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x20 + lVar28)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x28 + lVar28)));
      auVar62 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x24 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x2c + lVar28)));
      auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x24 + lVar28)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x2c + lVar28)));
      auVar53 = vunpcklps_avx(auVar43,auVar45);
      auVar57 = vunpcklps_avx(auVar46,auVar62);
      puVar1 = (undefined8 *)(uVar42 + 0x30 + lVar28);
      local_1018 = *puVar1;
      uStack_1010 = puVar1[1];
      auVar62 = vunpckhps_avx(auVar46,auVar62);
      puVar1 = (undefined8 *)(uVar42 + 0x40 + lVar28);
      local_1168 = *puVar1;
      uStack_1160 = puVar1[1];
      auVar43 = vsubps_avx(auVar54,auVar52);
      auVar44 = vsubps_avx(auVar55,auVar44);
      auVar45 = vsubps_avx(auVar56,auVar61);
      auVar46 = vsubps_avx(auVar57,auVar54);
      auVar62 = vsubps_avx(auVar62,auVar55);
      auVar61 = vsubps_avx(auVar53,auVar56);
      auVar66._0_4_ = auVar44._0_4_ * auVar61._0_4_;
      auVar66._4_4_ = auVar44._4_4_ * auVar61._4_4_;
      auVar66._8_4_ = auVar44._8_4_ * auVar61._8_4_;
      auVar66._12_4_ = auVar44._12_4_ * auVar61._12_4_;
      local_10d8 = vfmsub231ps_fma(auVar66,auVar62,auVar45);
      auVar71._0_4_ = auVar45._0_4_ * auVar46._0_4_;
      auVar71._4_4_ = auVar45._4_4_ * auVar46._4_4_;
      auVar71._8_4_ = auVar45._8_4_ * auVar46._8_4_;
      auVar71._12_4_ = auVar45._12_4_ * auVar46._12_4_;
      local_10c8 = vfmsub231ps_fma(auVar71,auVar61,auVar43);
      auVar72._0_4_ = auVar43._0_4_ * auVar62._0_4_;
      auVar72._4_4_ = auVar43._4_4_ * auVar62._4_4_;
      auVar72._8_4_ = auVar43._8_4_ * auVar62._8_4_;
      auVar72._12_4_ = auVar43._12_4_ * auVar62._12_4_;
      uVar65 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar84._4_4_ = uVar65;
      auVar84._0_4_ = uVar65;
      auVar84._8_4_ = uVar65;
      auVar84._12_4_ = uVar65;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar65 = *(undefined4 *)(ray + k * 4);
      auVar20._4_4_ = uVar65;
      auVar20._0_4_ = uVar65;
      auVar20._8_4_ = uVar65;
      auVar20._12_4_ = uVar65;
      auVar54 = vsubps_avx512vl(auVar54,auVar20);
      local_10b8 = vfmsub231ps_fma(auVar72,auVar46,auVar44);
      uVar65 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar21._4_4_ = uVar65;
      auVar21._0_4_ = uVar65;
      auVar21._8_4_ = uVar65;
      auVar21._12_4_ = uVar65;
      auVar55 = vsubps_avx512vl(auVar55,auVar21);
      uVar65 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar22._4_4_ = uVar65;
      auVar22._0_4_ = uVar65;
      auVar22._8_4_ = uVar65;
      auVar22._12_4_ = uVar65;
      auVar56 = vsubps_avx512vl(auVar56,auVar22);
      auVar57 = vmulps_avx512vl(auVar52,auVar56);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar53);
      auVar58 = vmulps_avx512vl(auVar53,auVar54);
      auVar58 = vfmsub231ps_avx512vl(auVar58,auVar56,auVar84);
      auVar59 = vmulps_avx512vl(auVar84,auVar55);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar54,auVar52);
      auVar53 = vmulps_avx512vl(local_10b8,auVar53);
      auVar52 = vfmadd231ps_avx512vl(auVar53,local_10c8,auVar52);
      auVar52 = vfmadd231ps_avx512vl(auVar52,local_10d8,auVar84);
      auVar53 = vandps_avx512vl(auVar52,auVar94._0_16_);
      auVar60 = vandps_avx512vl(auVar52,auVar88._0_16_);
      auVar61 = vmulps_avx512vl(auVar61,auVar59);
      auVar62 = vfmadd231ps_avx512vl(auVar61,auVar58,auVar62);
      auVar46 = vfmadd231ps_fma(auVar62,auVar57,auVar46);
      uVar30 = auVar60._0_4_;
      tNear.field_0._0_4_ = (float)(uVar30 ^ auVar46._0_4_);
      uVar32 = auVar60._4_4_;
      tNear.field_0._4_4_ = (float)(uVar32 ^ auVar46._4_4_);
      uVar35 = auVar60._8_4_;
      tNear.field_0._8_4_ = (float)(uVar35 ^ auVar46._8_4_);
      uVar81 = auVar60._12_4_;
      tNear.field_0._12_4_ = (float)(uVar81 ^ auVar46._12_4_);
      auVar45 = vmulps_avx512vl(auVar45,auVar59);
      auVar44 = vfmadd231ps_avx512vl(auVar45,auVar44,auVar58);
      auVar43 = vfmadd231ps_fma(auVar44,auVar43,auVar57);
      auVar78._0_4_ = (float)(uVar30 ^ auVar43._0_4_);
      auVar78._4_4_ = (float)(uVar32 ^ auVar43._4_4_);
      auVar78._8_4_ = (float)(uVar35 ^ auVar43._8_4_);
      auVar78._12_4_ = (float)(uVar81 ^ auVar43._12_4_);
      auVar43 = auVar95._0_16_;
      uVar16 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar43,5);
      uVar17 = vcmpps_avx512vl(auVar78,auVar43,5);
      uVar18 = vcmpps_avx512vl(auVar52,auVar43,4);
      auVar83._0_4_ = tNear.field_0._0_4_ + auVar78._0_4_;
      auVar83._4_4_ = tNear.field_0._4_4_ + auVar78._4_4_;
      auVar83._8_4_ = tNear.field_0._8_4_ + auVar78._8_4_;
      auVar83._12_4_ = tNear.field_0._12_4_ + auVar78._12_4_;
      uVar19 = vcmpps_avx512vl(auVar83,auVar53,2);
      bVar40 = (byte)uVar16 & (byte)uVar17 & (byte)uVar18 & (byte)uVar19;
      if (bVar40 != 0) {
        auVar79._0_4_ = auVar56._0_4_ * local_10b8._0_4_;
        auVar79._4_4_ = auVar56._4_4_ * local_10b8._4_4_;
        auVar79._8_4_ = auVar56._8_4_ * local_10b8._8_4_;
        auVar79._12_4_ = auVar56._12_4_ * local_10b8._12_4_;
        auVar43 = vfmadd213ps_fma(auVar55,local_10c8,auVar79);
        auVar43 = vfmadd213ps_fma(auVar54,local_10d8,auVar43);
        uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar23._4_4_ = uVar65;
        auVar23._0_4_ = uVar65;
        auVar23._8_4_ = uVar65;
        auVar23._12_4_ = uVar65;
        auVar44 = vmulps_avx512vl(auVar53,auVar23);
        fVar82 = *(float *)(ray + k * 4 + 0x80);
        auVar77._0_4_ = (float)(uVar30 ^ auVar43._0_4_);
        auVar77._4_4_ = (float)(uVar32 ^ auVar43._4_4_);
        auVar77._8_4_ = (float)(uVar35 ^ auVar43._8_4_);
        auVar77._12_4_ = (float)(uVar81 ^ auVar43._12_4_);
        auVar80._0_4_ = fVar82 * auVar53._0_4_;
        auVar80._4_4_ = fVar82 * auVar53._4_4_;
        auVar80._8_4_ = fVar82 * auVar53._8_4_;
        auVar80._12_4_ = fVar82 * auVar53._12_4_;
        uVar16 = vcmpps_avx512vl(auVar77,auVar80,2);
        uVar17 = vcmpps_avx512vl(auVar44,auVar77,1);
        bVar40 = (byte)uVar16 & (byte)uVar17 & bVar40;
        if (bVar40 != 0) {
          auVar43 = vrcp14ps_avx512vl(auVar53);
          auVar44 = vfnmadd213ps_avx512vl(auVar53,auVar43,auVar96._0_16_);
          auVar43 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
          fVar73 = auVar43._0_4_;
          local_10e8._0_4_ = fVar73 * auVar77._0_4_;
          fVar74 = auVar43._4_4_;
          local_10e8._4_4_ = fVar74 * auVar77._4_4_;
          fVar75 = auVar43._8_4_;
          local_10e8._8_4_ = fVar75 * auVar77._8_4_;
          fVar76 = auVar43._12_4_;
          local_10e8._12_4_ = fVar76 * auVar77._12_4_;
          auVar70 = ZEXT1664(local_10e8);
          local_1108[0] = fVar73 * tNear.field_0._0_4_;
          local_1108[1] = fVar74 * tNear.field_0._4_4_;
          local_1108[2] = fVar75 * tNear.field_0._8_4_;
          local_1108[3] = fVar76 * tNear.field_0._12_4_;
          local_10f8[0] = fVar73 * auVar78._0_4_;
          local_10f8[1] = fVar74 * auVar78._4_4_;
          local_10f8[2] = fVar75 * auVar78._8_4_;
          local_10f8[3] = fVar76 * auVar78._12_4_;
          auVar67._8_4_ = 0x7f800000;
          auVar67._0_8_ = 0x7f8000007f800000;
          auVar67._12_4_ = 0x7f800000;
          auVar43 = vblendmps_avx512vl(auVar67,local_10e8);
          auVar63._0_4_ =
               (uint)(bVar40 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar40 & 1) * 0x7f800000;
          bVar10 = (bool)(bVar40 >> 1 & 1);
          auVar63._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * 0x7f800000;
          bVar10 = (bool)(bVar40 >> 2 & 1);
          auVar63._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * 0x7f800000;
          bVar10 = (bool)(bVar40 >> 3 & 1);
          auVar63._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * 0x7f800000;
          auVar43 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar43 = vminps_avx(auVar43,auVar63);
          auVar44 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar44,auVar43);
          uVar16 = vcmpps_avx512vl(auVar63,auVar43,0);
          bVar29 = (byte)uVar16 & bVar40;
          do {
            auVar43 = auVar95._0_16_;
            bVar26 = bVar40;
            if (bVar29 != 0) {
              bVar26 = bVar29;
            }
            uVar30 = 0;
            for (uVar32 = (uint)bVar26; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
              uVar30 = uVar30 + 1;
            }
            uVar35 = uVar30 & 0xff;
            local_11b8 = (ulong)uVar35;
            uVar32 = *(uint *)((long)&local_1018 + local_11b8 * 4);
            local_11c0 = (local_11a8->geometries).items[uVar32].ptr;
            if ((local_11c0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar40 = ~(byte)(1 << (uVar30 & 0x1f)) & bVar40;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_11c0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar41 = (ulong)(uVar35 << 2);
                uVar65 = *(undefined4 *)((long)local_1108 + uVar41);
                uVar3 = *(undefined4 *)((long)local_10f8 + uVar41);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + uVar41);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10d8 + uVar41);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10c8 + uVar41);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10b8 + uVar41);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar65;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1168 + uVar41);
                *(uint *)(ray + k * 4 + 0x120) = uVar32;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_10a8 = auVar70._0_16_;
              local_1088 = vmovdqa64_avx512vl(auVar92._0_16_);
              local_1078 = auVar91._0_16_;
              local_1068 = auVar90._0_16_;
              local_1058 = auVar89._0_16_;
              local_1048 = auVar87._0_16_;
              local_1038 = auVar86._0_16_;
              local_1028 = auVar85._0_16_;
              uVar41 = (ulong)(uVar35 * 4);
              uVar65 = *(undefined4 *)((long)local_1108 + uVar41);
              h.u.field_0.i[1] = uVar65;
              h.u.field_0.i[0] = uVar65;
              h.u.field_0.i[2] = uVar65;
              h.u.field_0.i[3] = uVar65;
              h.v.field_0.v[0] = *(float *)((long)local_10f8 + uVar41);
              h.geomID.field_0 =
                   (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
              uVar65 = *(undefined4 *)((long)&local_1168 + uVar41);
              h.primID.field_0.i[1] = uVar65;
              h.primID.field_0.i[0] = uVar65;
              h.primID.field_0.i[2] = uVar65;
              h.primID.field_0.i[3] = uVar65;
              uVar65 = *(undefined4 *)(local_10d8 + uVar41);
              h.Ng.field_0._4_4_ = uVar65;
              h.Ng.field_0._0_4_ = uVar65;
              h.Ng.field_0._8_4_ = uVar65;
              h.Ng.field_0._12_4_ = uVar65;
              h.Ng.field_0._16_4_ = *(undefined4 *)(local_10c8 + uVar41);
              uVar65 = *(undefined4 *)(local_10b8 + uVar41);
              h.Ng.field_0._36_4_ = uVar65;
              h.Ng.field_0._32_4_ = uVar65;
              h.Ng.field_0._40_4_ = uVar65;
              h.Ng.field_0._44_4_ = uVar65;
              h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
              h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
              h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                            ZEXT1632((undefined1  [16])h.u.field_0));
              h.instID[0].field_0.i[1] = context->user->instID[0];
              h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + uVar41);
              auVar44 = auVar93._0_16_;
              local_11d8 = vmovdqa64_avx512vl(auVar44);
              args.valid = (int *)local_11d8;
              args.geometryUserPtr = local_11c0->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              local_1098 = vmovdqa64_avx512vl(auVar44);
              auVar44 = vmovdqa64_avx512vl(auVar44);
              args.ray = (RTCRayN *)ray;
              if (local_11c0->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_11c0->intersectionFilterN)(&args);
                auVar44 = local_11d8;
              }
              uVar41 = vptestmd_avx512vl(auVar44,auVar44);
              if ((uVar41 & 0xf) == 0) {
LAB_01cb2c1c:
                *(float *)(ray + k * 4 + 0x80) = fVar82;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_11c0->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var9)(&args);
                  auVar44 = local_11d8;
                }
                uVar41 = vptestmd_avx512vl(auVar44,auVar44);
                uVar41 = uVar41 & 0xf;
                bVar29 = (byte)uVar41;
                if (bVar29 == 0) goto LAB_01cb2c1c;
                iVar2 = *(int *)(args.hit + 4);
                iVar24 = *(int *)(args.hit + 8);
                iVar25 = *(int *)(args.hit + 0xc);
                bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar12 = SUB81(uVar41 >> 3,0);
                *(uint *)(args.ray + 0xc0) =
                     (uint)(bVar29 & 1) * *(int *)args.hit |
                     (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xc0);
                *(uint *)(args.ray + 0xc4) =
                     (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xc4);
                *(uint *)(args.ray + 200) =
                     (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(args.ray + 200);
                *(uint *)(args.ray + 0xcc) =
                     (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(args.ray + 0xcc);
                iVar2 = *(int *)(args.hit + 0x14);
                iVar24 = *(int *)(args.hit + 0x18);
                iVar25 = *(int *)(args.hit + 0x1c);
                bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar12 = SUB81(uVar41 >> 3,0);
                *(uint *)(args.ray + 0xd0) =
                     (uint)(bVar29 & 1) * *(int *)(args.hit + 0x10) |
                     (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xd0);
                *(uint *)(args.ray + 0xd4) =
                     (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xd4);
                *(uint *)(args.ray + 0xd8) =
                     (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(args.ray + 0xd8);
                *(uint *)(args.ray + 0xdc) =
                     (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(args.ray + 0xdc);
                iVar2 = *(int *)(args.hit + 0x24);
                iVar24 = *(int *)(args.hit + 0x28);
                iVar25 = *(int *)(args.hit + 0x2c);
                bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar12 = SUB81(uVar41 >> 3,0);
                *(uint *)(args.ray + 0xe0) =
                     (uint)(bVar29 & 1) * *(int *)(args.hit + 0x20) |
                     (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xe0);
                *(uint *)(args.ray + 0xe4) =
                     (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xe4);
                *(uint *)(args.ray + 0xe8) =
                     (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(args.ray + 0xe8);
                *(uint *)(args.ray + 0xec) =
                     (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(args.ray + 0xec);
                iVar2 = *(int *)(args.hit + 0x34);
                iVar24 = *(int *)(args.hit + 0x38);
                iVar25 = *(int *)(args.hit + 0x3c);
                bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar12 = SUB81(uVar41 >> 3,0);
                *(uint *)(args.ray + 0xf0) =
                     (uint)(bVar29 & 1) * *(int *)(args.hit + 0x30) |
                     (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xf0);
                *(uint *)(args.ray + 0xf4) =
                     (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xf4);
                *(uint *)(args.ray + 0xf8) =
                     (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(args.ray + 0xf8);
                *(uint *)(args.ray + 0xfc) =
                     (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(args.ray + 0xfc);
                iVar2 = *(int *)(args.hit + 0x44);
                iVar24 = *(int *)(args.hit + 0x48);
                iVar25 = *(int *)(args.hit + 0x4c);
                bVar10 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar12 = SUB81(uVar41 >> 3,0);
                *(uint *)(args.ray + 0x100) =
                     (uint)(bVar29 & 1) * *(int *)(args.hit + 0x40) |
                     (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0x100);
                *(uint *)(args.ray + 0x104) =
                     (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0x104);
                *(uint *)(args.ray + 0x108) =
                     (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(args.ray + 0x108);
                *(uint *)(args.ray + 0x10c) =
                     (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(args.ray + 0x10c);
                auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar44;
                auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar44;
                auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar44;
                auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar44;
                fVar82 = *(float *)(ray + k * 4 + 0x80);
              }
              auVar69._4_4_ = fVar82;
              auVar69._0_4_ = fVar82;
              auVar69._8_4_ = fVar82;
              auVar69._12_4_ = fVar82;
              auVar70 = ZEXT1664(local_10a8);
              uVar16 = vcmpps_avx512vl(local_10a8,auVar69,2);
              bVar40 = ~(byte)(1 << ((uint)local_11b8 & 0x1f)) & bVar40 & (byte)uVar16;
              auVar85 = ZEXT1664(local_1028);
              auVar86 = ZEXT1664(local_1038);
              auVar87 = ZEXT1664(local_1048);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar88 = ZEXT1664(auVar44);
              auVar89 = ZEXT1664(local_1058);
              auVar90 = ZEXT1664(local_1068);
              auVar91 = ZEXT1664(local_1078);
              auVar44 = vmovdqa64_avx512vl(local_1088);
              auVar92 = ZEXT1664(auVar44);
              auVar44 = vmovdqa64_avx512vl(local_1098);
              auVar93 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar94 = ZEXT1664(auVar44);
              auVar43 = vxorps_avx512vl(auVar43,auVar43);
              auVar95 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar96 = ZEXT1664(auVar43);
            }
            if (bVar40 == 0) break;
            auVar68._8_4_ = 0x7f800000;
            auVar68._0_8_ = 0x7f8000007f800000;
            auVar68._12_4_ = 0x7f800000;
            auVar43 = vblendmps_avx512vl(auVar68,auVar70._0_16_);
            auVar64._0_4_ =
                 (uint)(bVar40 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar40 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar40 >> 1 & 1);
            auVar64._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar40 >> 2 & 1);
            auVar64._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar40 >> 3 & 1);
            auVar64._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * 0x7f800000;
            auVar43 = vshufps_avx(auVar64,auVar64,0xb1);
            auVar43 = vminps_avx(auVar43,auVar64);
            auVar44 = vshufpd_avx(auVar43,auVar43,1);
            auVar43 = vminps_avx(auVar44,auVar43);
            uVar16 = vcmpps_avx512vl(auVar64,auVar43,0);
            bVar29 = (byte)uVar16 & bVar40;
          } while( true );
        }
      }
    }
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar70 = ZEXT1664(CONCAT412(uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }